

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

bool double_conversion::Advance<unsigned_short_const*>
               (unsigned_short **it,uc16 separator,int base,unsigned_short **end)

{
  ushort *puVar1;
  ushort *puVar2;
  bool bVar3;
  undefined6 in_register_00000032;
  ushort *puVar4;
  
  puVar4 = *it;
  if ((int)CONCAT62(in_register_00000032,separator) == 0) {
    *it = puVar4 + 1;
    bVar3 = puVar4 + 1 == *end;
  }
  else {
    bVar3 = isDigit((uint)*puVar4,base);
    puVar1 = puVar4 + 1;
    *it = puVar1;
    puVar2 = *end;
    if ((~bVar3 & 1U) != 0 || puVar1 == puVar2) {
      bVar3 = bVar3 || puVar1 == puVar2;
    }
    else {
      puVar4 = puVar4 + 2;
      if (puVar4 == puVar2) {
        bVar3 = false;
      }
      else {
        if ((*puVar1 == separator) && (bVar3 = isDigit((uint)*puVar4,base), bVar3)) {
          *it = puVar4;
        }
        bVar3 = *it == *end;
      }
    }
  }
  return bVar3;
}

Assistant:

static bool Advance (Iterator* it, uc16 separator, int base, Iterator& end) {
  if (separator == StringToDoubleConverter::kNoSeparator) {
    ++(*it);
    return *it == end;
  }
  if (!isDigit(**it, base)) {
    ++(*it);
    return *it == end;
  }
  ++(*it);
  if (*it == end) return true;
  if (*it + 1 == end) return false;
  if (**it == separator && isDigit(*(*it + 1), base)) {
    ++(*it);
  }
  return *it == end;
}